

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O2

int16_t anon_unknown.dwarf_1728cc::getMinGroupingForLocale(Locale *locale)

{
  UChar *pUVar1;
  int16_t iVar2;
  int32_t resultLen;
  UErrorCode localStatus;
  LocalUResourceBundlePointer bundle;
  int32_t local_18;
  UErrorCode local_14;
  LocalUResourceBundlePointer local_10;
  
  local_14 = U_ZERO_ERROR;
  local_10.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)ures_open_63((char *)0x0,locale->fullName,&local_14);
  local_18 = 0;
  pUVar1 = ures_getStringByKeyWithFallback_63
                     ((UResourceBundle *)local_10.super_LocalPointerBase<UResourceBundle>.ptr,
                      "NumberElements/minimumGroupingDigits",&local_18,&local_14);
  iVar2 = 1;
  if ((local_14 < U_ILLEGAL_ARGUMENT_ERROR) && (local_18 == 1)) {
    iVar2 = *pUVar1 + L'￐';
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_10);
  return iVar2;
}

Assistant:

int16_t getMinGroupingForLocale(const Locale& locale) {
    // TODO: Cache this?
    UErrorCode localStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer bundle(ures_open(NULL, locale.getName(), &localStatus));
    int32_t resultLen = 0;
    const char16_t* result = ures_getStringByKeyWithFallback(
        bundle.getAlias(),
        "NumberElements/minimumGroupingDigits",
        &resultLen,
        &localStatus);
    // TODO: Is it safe to assume resultLen == 1? Would locales set minGrouping >= 10?
    if (U_FAILURE(localStatus) || resultLen != 1) {
        return 1;
    }
    return result[0] - u'0';
}